

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.c
# Opt level: O3

unsigned_long strchrcount(char *haystack,char needle)

{
  unsigned_long uVar1;
  char cVar2;
  char *pcVar3;
  bool bVar4;
  
  if ((haystack != (char *)0x0) && (cVar2 = *haystack, cVar2 != '\0')) {
    pcVar3 = haystack + 1;
    uVar1 = 0;
    do {
      bVar4 = cVar2 == needle;
      cVar2 = *pcVar3;
      pcVar3 = pcVar3 + 1;
      uVar1 = uVar1 + bVar4;
    } while (cVar2 != '\0');
    return uVar1;
  }
  return 0;
}

Assistant:

unsigned long strchrcount(char * haystack, char needle)
{
	unsigned long       i=0;

	if(!haystack)
		return 0;

	while(*haystack)
	{
		if(*haystack==needle)
			i++;

		haystack++;
	}

	return i;
}